

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void __thiscall deqp::gls::VertexArrayTest::compare(VertexArrayTest *this)

{
  int *value;
  int *value_00;
  int *value_01;
  ostringstream *poVar1;
  int iVar2;
  RGBA a;
  RGBA a_00;
  int iVar3;
  uint uVar4;
  ContextArrayPack *pCVar5;
  TestLog *pTVar6;
  void *pvVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  MessageBuilder *pMVar13;
  RGBA threshold;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Surface *pSVar18;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  ContextArrayPack *pCVar19;
  LogImage *this_00;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int dx;
  int iVar25;
  int iVar26;
  int iVar27;
  allocator<char> local_498;
  allocator<char> local_497;
  allocator<char> local_496;
  allocator<char> local_495;
  allocator<char> local_494;
  allocator<char> local_493;
  allocator<char> local_492;
  allocator<char> local_491;
  ContextArrayPack *local_490;
  Surface *local_488;
  ulong local_480;
  int local_478;
  int local_474;
  Surface *local_470;
  int local_468;
  uint local_464;
  uint local_460;
  uint local_45c;
  uint local_458;
  uint local_454;
  Surface error;
  string local_410;
  undefined1 local_3f0 [32];
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  LogImageSet local_310;
  LogImage local_2d0;
  LogImage local_240;
  MessageBuilder local_1b0;
  
  pCVar19 = this->m_rrArrayPack;
  local_488 = &pCVar19->m_screen;
  pCVar5 = this->m_glArrayPack;
  local_470 = &pCVar5->m_screen;
  iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar11) + 0x20) < 2) {
    value = &this->m_maxDiffRed;
    value_00 = &this->m_maxDiffGreen;
    value_01 = &this->m_maxDiffBlue;
    threshold.m_value =
         this->m_maxDiffGreen << 8 | this->m_maxDiffRed | this->m_maxDiffBlue << 0x10 | 0xff000000;
    tcu::Surface::Surface(&error,(pCVar19->m_screen).m_width,(pCVar19->m_screen).m_height);
    this->m_isOk = true;
    local_478 = -1;
    uVar21 = 0;
    pSVar18 = local_488;
    local_490 = pCVar19;
    while (iVar11 = (int)uVar21, iVar11 < (pCVar19->m_screen).m_height) {
      uVar22 = iVar11 + 1;
      local_474 = iVar11 + -1;
      iVar11 = 0;
      local_480 = uVar21;
      while (iVar2 = pSVar18->m_width, iVar11 < iVar2) {
        iVar20 = (int)uVar21;
        a.m_value = *(deUint32 *)
                     ((long)(pCVar5->m_screen).m_pixels.m_ptr +
                     (long)((pCVar5->m_screen).m_width * iVar20 + iVar11) * 4);
        if ((((iVar20 == 0) || (iVar11 == 0)) || (uVar22 == (pCVar19->m_screen).m_height)) ||
           (iVar14 = iVar11 + 1, iVar14 == iVar2)) {
          *(deUint32 *)((long)error.m_pixels.m_ptr + (long)(error.m_width * iVar20 + iVar11) * 4) =
               (((a.m_value & 0xffff) >> 1) + 0x7f80 & 0xff00) + (a.m_value & 0xff00ff) + -0x1000000
          ;
          iVar11 = iVar11 + 1;
        }
        else {
          pvVar7 = (pCVar19->m_screen).m_pixels.m_ptr;
          a_00.m_value = *(deUint32 *)((long)pvVar7 + (long)(iVar2 * iVar20 + iVar11) * 4);
          bVar9 = tcu::compareThreshold
                            (a_00,(RGBA)*(deUint32 *)
                                         ((long)pvVar7 + (long)(iVar2 * iVar20 + -1 + iVar11) * 4),
                             threshold);
          if (bVar9) {
LAB_008519b3:
            bVar9 = tcu::compareThreshold
                              (a_00,(RGBA)*(deUint32 *)
                                           ((long)(local_490->m_screen).m_pixels.m_ptr +
                                           (long)((local_490->m_screen).m_width * local_474 + iVar11
                                                 ) * 4),threshold);
            bVar10 = true;
            if (!bVar9) {
              bVar10 = tcu::compareThreshold
                                 (a_00,(RGBA)*(deUint32 *)
                                              ((long)(local_490->m_screen).m_pixels.m_ptr +
                                              (long)(int)((local_490->m_screen).m_width * uVar22 +
                                                         iVar11) * 4),threshold);
            }
          }
          else {
            bVar9 = tcu::compareThreshold
                              (a_00,(RGBA)*(deUint32 *)
                                           ((long)(local_490->m_screen).m_pixels.m_ptr +
                                           (long)((local_490->m_screen).m_width * (int)local_480 +
                                                 iVar14) * 4),threshold);
            if (bVar9) goto LAB_008519b3;
            bVar10 = false;
          }
          bVar9 = tcu::compareThreshold
                            (a,(RGBA)*(deUint32 *)
                                      ((long)(pCVar5->m_screen).m_pixels.m_ptr +
                                      (long)((pCVar5->m_screen).m_width * (int)local_480 +
                                            iVar11 + -1) * 4),threshold);
          if (bVar9) {
LAB_00851a5f:
            bVar9 = tcu::compareThreshold
                              (a,(RGBA)*(deUint32 *)
                                        ((long)(pCVar5->m_screen).m_pixels.m_ptr +
                                        (long)((pCVar5->m_screen).m_width * local_474 + iVar11) * 4)
                               ,threshold);
            if (!bVar9) {
              bVar9 = tcu::compareThreshold
                                (a,(RGBA)*(deUint32 *)
                                          ((long)(pCVar5->m_screen).m_pixels.m_ptr +
                                          (long)(int)((pCVar5->m_screen).m_width * uVar22 + iVar11)
                                          * 4),threshold);
              goto LAB_00851aaf;
            }
LAB_00851abc:
            local_458 = a_00.m_value & 0xff;
            local_45c = a_00.m_value >> 8 & 0xff;
            local_454 = a_00.m_value >> 0x10 & 0xff;
            iVar2 = *value;
            iVar20 = *value_00;
            iVar3 = *value_01;
            local_460 = a.m_value & 0xff;
            local_464 = a.m_value >> 8 & 0xff;
            bVar9 = false;
            iVar23 = local_478;
            iVar12 = -1;
            while ((iVar12 < 2 && (!bVar9))) {
              iVar25 = -1;
              while ((iVar25 < 2 && (!bVar9))) {
                uVar4 = *(uint *)((long)(pCVar5->m_screen).m_pixels.m_ptr +
                                 (long)((pCVar5->m_screen).m_width * iVar23 + iVar11 + iVar25) * 4);
                iVar24 = local_458 - (uVar4 & 0xff);
                iVar8 = -iVar24;
                if (0 < iVar24) {
                  iVar8 = iVar24;
                }
                iVar15 = local_45c - (uVar4 >> 8 & 0xff);
                iVar24 = -iVar15;
                if (0 < iVar15) {
                  iVar24 = iVar15;
                }
                iVar16 = local_454 - (uVar4 >> 0x10 & 0xff);
                iVar15 = -iVar16;
                if (0 < iVar16) {
                  iVar15 = iVar16;
                }
                uVar4 = *(uint *)((long)(local_490->m_screen).m_pixels.m_ptr +
                                 (long)((local_490->m_screen).m_width * iVar23 + iVar11 + iVar25) *
                                 4);
                iVar26 = (uVar4 & 0xff) - local_460;
                iVar16 = -iVar26;
                if (0 < iVar26) {
                  iVar16 = iVar26;
                }
                iVar27 = (uVar4 >> 8 & 0xff) - local_464;
                iVar26 = -iVar27;
                if (0 < iVar27) {
                  iVar26 = iVar27;
                }
                iVar17 = (uVar4 >> 0x10 & 0xff) - (a.m_value >> 0x10 & 0xff);
                iVar27 = -iVar17;
                if (0 < iVar17) {
                  iVar27 = iVar17;
                }
                bVar10 = iVar8 <= iVar2 && (iVar24 <= iVar20 && iVar15 <= iVar3);
                bVar9 = iVar27 <= iVar3 || bVar10;
                if (iVar20 < iVar26) {
                  bVar9 = bVar10;
                }
                if (iVar2 < iVar16) {
                  bVar9 = bVar10;
                }
                iVar25 = iVar25 + 1;
              }
              iVar23 = iVar23 + 1;
              local_468 = iVar12;
              iVar12 = iVar12 + 1;
            }
            if (bVar9) goto LAB_00851c70;
            *(undefined4 *)
             ((long)error.m_pixels.m_ptr + (long)(error.m_width * (int)local_480 + iVar11) * 4) =
                 0xff0000ff;
            this->m_isOk = false;
            pSVar18 = local_488;
            pCVar19 = local_490;
            uVar21 = local_480;
            iVar11 = iVar14;
          }
          else {
            bVar9 = tcu::compareThreshold
                              (a,(RGBA)*(deUint32 *)
                                        ((long)(pCVar5->m_screen).m_pixels.m_ptr +
                                        (long)((pCVar5->m_screen).m_width * (int)local_480 + iVar14)
                                        * 4),threshold);
            if (bVar9) goto LAB_00851a5f;
            bVar9 = false;
LAB_00851aaf:
            if ((bVar10 | bVar9) == 1) goto LAB_00851abc;
LAB_00851c70:
            uVar4 = *(uint *)((long)(pCVar5->m_screen).m_pixels.m_ptr +
                             (long)((pCVar5->m_screen).m_width * (int)local_480 + iVar11) * 4);
            *(uint *)((long)error.m_pixels.m_ptr +
                     (long)(error.m_width * (int)local_480 + iVar11) * 4) =
                 (uVar4 & 0xff00ff) + (((uVar4 & 0xffff) >> 1) + 0x7f80 & 0xff00) + -0x1000000;
            pSVar18 = local_488;
            pCVar19 = local_490;
            uVar21 = local_480;
            iVar11 = iVar14;
          }
        }
      }
      local_478 = local_478 + 1;
      uVar21 = (ulong)uVar22;
    }
    pTVar6 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    iVar11 = (int)pTVar6;
    if (this->m_isOk == false) {
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = pTVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Image comparison failed, threshold = (");
      pMVar13 = tcu::MessageBuilder::operator<<(&local_1b0,value);
      std::operator<<((ostream *)&pMVar13->m_str,", ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,value_00);
      std::operator<<((ostream *)&pMVar13->m_str,", ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,value_01);
      std::operator<<((ostream *)&pMVar13->m_str,")");
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3f0,"Compare result",&local_491);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"Result of rendering",&local_492);
      tcu::LogImageSet::LogImageSet(&local_310,(string *)local_3f0,&local_410);
      tcu::LogImageSet::write(&local_310,iVar11,__buf_01,(size_t)this);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"Result",&local_493);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"Result",&local_494);
      pSVar18 = local_470;
      tcu::LogImage::LogImage
                ((LogImage *)&local_1b0,&local_370,&local_390,local_470,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&local_1b0,iVar11,__buf_02,(size_t)pSVar18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_3f0 + 0x40),"Reference",&local_495);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_3f0 + 0x20),"Reference",&local_496);
      pSVar18 = local_488;
      tcu::LogImage::LogImage
                (&local_2d0,(string *)(local_3f0 + 0x40),(string *)(local_3f0 + 0x20),local_488,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d0,iVar11,__buf_03,(size_t)pSVar18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"ErrorMask",&local_497);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"Error mask",&local_498);
      pSVar18 = &error;
      tcu::LogImage::LogImage
                (&local_240,&local_330,&local_350,pSVar18,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,iVar11,__buf_04,(size_t)pSVar18);
      tcu::TestLog::endImageSet(pTVar6);
      tcu::LogImage::~LogImage(&local_240);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_330);
      tcu::LogImage::~LogImage(&local_2d0);
      std::__cxx11::string::~string((string *)(local_3f0 + 0x20));
      std::__cxx11::string::~string((string *)(local_3f0 + 0x40));
      tcu::LogImage::~LogImage((LogImage *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_370);
      tcu::LogImageSet::~LogImageSet(&local_310);
      std::__cxx11::string::~string((string *)&local_410);
      this_00 = (LogImage *)local_3f0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"Compare result",(allocator<char> *)&local_370);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"Result of rendering",(allocator<char> *)&local_390);
      tcu::LogImageSet::LogImageSet((LogImageSet *)&local_2d0,&local_240.m_name,&local_310.m_name);
      tcu::LogImageSet::write((LogImageSet *)&local_2d0,iVar11,__buf,(size_t)this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3f0,"Result",(allocator<char> *)(local_3f0 + 0x40));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"Result",(allocator<char> *)(local_3f0 + 0x20));
      pSVar18 = local_470;
      tcu::LogImage::LogImage
                ((LogImage *)&local_1b0,(string *)local_3f0,&local_410,local_470,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&local_1b0,iVar11,__buf_00,(size_t)pSVar18);
      tcu::TestLog::endImageSet(pTVar6);
      tcu::LogImage::~LogImage((LogImage *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)local_3f0);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_310);
      this_00 = &local_240;
    }
    std::__cxx11::string::~string((string *)this_00);
    tcu::Surface::~Surface(&error);
  }
  else {
    local_1b0.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!"
                   );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    pTVar6 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    tcu::Surface::getAccess((ConstPixelBufferAccess *)&local_1b0,local_488);
    tcu::Surface::getAccess((ConstPixelBufferAccess *)&local_2d0,local_470);
    bVar9 = tcu::fuzzyCompare(pTVar6,"Compare Results","Compare Results",
                              (ConstPixelBufferAccess *)&local_1b0,
                              (ConstPixelBufferAccess *)&local_2d0,1.5,COMPARE_LOG_RESULT);
    this->m_isOk = bVar9;
  }
  return;
}

Assistant:

void VertexArrayTest::compare (void)
{
	const tcu::Surface&	ref		= m_rrArrayPack->getSurface();
	const tcu::Surface&	screen	= m_glArrayPack->getSurface();

	if (m_renderCtx.getRenderTarget().getNumSamples() > 1)
	{
		// \todo [mika] Improve compare when using multisampling
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!" << tcu::TestLog::EndMessage;
		m_isOk = tcu::fuzzyCompare(m_testCtx.getLog(), "Compare Results", "Compare Results", ref.getAccess(), screen.getAccess(), 1.5f, tcu::COMPARE_LOG_RESULT);
	}
	else
	{
		tcu::RGBA		threshold	(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue, 255);
		tcu::Surface	error		(ref.getWidth(), ref.getHeight());

		m_isOk = true;

		for (int y = 0; y < ref.getHeight(); y++)
		{
			for (int x = 0; x < ref.getWidth(); x++)
			{
				tcu::RGBA	refPixel		= ref.getPixel(x, y);
				tcu::RGBA	screenPixel		= screen.getPixel(x, y);
				bool		isOkPixel		= false;

				if (y == 0 || y + 1 == ref.getHeight() || x == 0 || x + 1 == ref.getWidth())
				{
					// Don't check borders since the pixel neighborhood is undefined
					error.setPixel(x, y, tcu::RGBA(screenPixel.getRed(), (screenPixel.getGreen() + 255) / 2, screenPixel.getBlue(), 255));
					continue;
				}

				// Don't do comparisons for this pixel if it belongs to a one-pixel-thin part (i.e. it doesn't have similar-color neighbors in both x and y directions) in both result and reference.
				// This fixes some false negatives.
				bool		refThin			= (!tcu::compareThreshold(refPixel, ref.getPixel(x-1, y  ), threshold) && !tcu::compareThreshold(refPixel, ref.getPixel(x+1, y  ), threshold)) ||
											  (!tcu::compareThreshold(refPixel, ref.getPixel(x  , y-1), threshold) && !tcu::compareThreshold(refPixel, ref.getPixel(x  , y+1), threshold));
				bool		screenThin		= (!tcu::compareThreshold(screenPixel, screen.getPixel(x-1, y  ), threshold) && !tcu::compareThreshold(screenPixel, screen.getPixel(x+1, y  ), threshold)) ||
											  (!tcu::compareThreshold(screenPixel, screen.getPixel(x  , y-1), threshold) && !tcu::compareThreshold(screenPixel, screen.getPixel(x  , y+1), threshold));

				if (refThin && screenThin)
					isOkPixel = true;
				else
				{
					for (int dy = -1; dy < 2 && !isOkPixel; dy++)
					{
						for (int dx = -1; dx < 2 && !isOkPixel; dx++)
						{
							// Check reference pixel against screen pixel
							{
								tcu::RGBA	screenCmpPixel	= screen.getPixel(x+dx, y+dy);
								deUint8		r				= (deUint8)deAbs32(refPixel.getRed()	- screenCmpPixel.getRed());
								deUint8		g				= (deUint8)deAbs32(refPixel.getGreen()	- screenCmpPixel.getGreen());
								deUint8		b				= (deUint8)deAbs32(refPixel.getBlue()	- screenCmpPixel.getBlue());

								if (r <= m_maxDiffRed && g <= m_maxDiffGreen && b <= m_maxDiffBlue)
									isOkPixel = true;
							}

							// Check screen pixels against reference pixel
							{
								tcu::RGBA	refCmpPixel		= ref.getPixel(x+dx, y+dy);
								deUint8		r				= (deUint8)deAbs32(refCmpPixel.getRed()		- screenPixel.getRed());
								deUint8		g				= (deUint8)deAbs32(refCmpPixel.getGreen()	- screenPixel.getGreen());
								deUint8		b				= (deUint8)deAbs32(refCmpPixel.getBlue()	- screenPixel.getBlue());

								if (r <= m_maxDiffRed && g <= m_maxDiffGreen && b <= m_maxDiffBlue)
									isOkPixel = true;
							}
						}
					}
				}

				if (isOkPixel)
					error.setPixel(x, y, tcu::RGBA(screen.getPixel(x, y).getRed(), (screen.getPixel(x, y).getGreen() + 255) / 2, screen.getPixel(x, y).getBlue(), 255));
				else
				{
					error.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					m_isOk = false;
				}
			}
		}

		tcu::TestLog& log = m_testCtx.getLog();
		if (!m_isOk)
		{
			log << TestLog::Message << "Image comparison failed, threshold = (" << m_maxDiffRed << ", " << m_maxDiffGreen << ", " << m_maxDiffBlue << ")" << TestLog::EndMessage;
			log << TestLog::ImageSet("Compare result", "Result of rendering")
				<< TestLog::Image("Result",		"Result",		screen)
				<< TestLog::Image("Reference",	"Reference",	ref)
				<< TestLog::Image("ErrorMask",	"Error mask",	error)
				<< TestLog::EndImageSet;
		}
		else
		{
			log << TestLog::ImageSet("Compare result", "Result of rendering")
				<< TestLog::Image("Result", "Result", screen)
				<< TestLog::EndImageSet;
		}
	}
}